

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::GeometryHelper_Extend_PointToLine
          (X3DImporter *this,list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pPoint,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pLine)

{
  bool bVar1;
  size_type sVar2;
  reference paVar3;
  _List_const_iterator<aiVector3t<float>_> local_70 [3];
  allocator local_51;
  string local_50;
  _List_const_iterator<aiVector3t<float>_> local_30;
  const_iterator pit_last;
  const_iterator pit;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pLine_local;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pPoint_local;
  X3DImporter *this_local;
  
  pit_last = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                       (pPoint);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(pPoint);
  std::_List_const_iterator<aiVector3t<float>_>::operator--(&local_30);
  sVar2 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(pPoint);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,
               "GeometryHelper_Extend_PointToLine.pPoint.size() can not be less than 2.",&local_51);
    Throw_ArgOutOfRange(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  local_70[0]._M_node =
       (_List_node_base *)std::_List_const_iterator<aiVector3t<float>_>::operator++(&pit_last,0);
  paVar3 = std::_List_const_iterator<aiVector3t<float>_>::operator*(local_70);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pLine,paVar3);
  while( true ) {
    bVar1 = std::operator!=(&pit_last,&local_30);
    if (!bVar1) break;
    paVar3 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&pit_last);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (pLine,paVar3);
    paVar3 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&pit_last);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (pLine,paVar3);
    std::_List_const_iterator<aiVector3t<float>_>::operator++(&pit_last);
  }
  paVar3 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&pit_last);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pLine,paVar3);
  return;
}

Assistant:

void X3DImporter::GeometryHelper_Extend_PointToLine(const std::list<aiVector3D>& pPoint, std::list<aiVector3D>& pLine)
{
    std::list<aiVector3D>::const_iterator pit = pPoint.begin();
    std::list<aiVector3D>::const_iterator pit_last = pPoint.end();

	--pit_last;

    if ( pPoint.size() < 2 )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Extend_PointToLine.pPoint.size() can not be less than 2." );
    }

	// add first point of first line.
	pLine.push_back(*pit++);
	// add internal points
	while(pit != pit_last)
	{
		pLine.push_back(*pit);// second point of previous line
		pLine.push_back(*pit);// first point of next line
		++pit;
	}
	// add last point of last line
	pLine.push_back(*pit);
}